

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

bool google::protobuf::anon_unknown_24::RetrieveOptionsAssumingRightPool
               (int depth,Message *options,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *option_entries)

{
  FieldDescriptor *this;
  ushort *puVar1;
  char *pcVar2;
  pointer pbVar3;
  pointer pbVar4;
  pointer ppFVar5;
  bool bVar6;
  int iVar7;
  pointer ppFVar8;
  int iVar9;
  int iVar10;
  Printer *this_00;
  AlphaNum *in_R8;
  Metadata MVar11;
  string tmp;
  string name;
  string fieldval;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  AlphaNum local_f0;
  Printer printer;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(option_entries);
  MVar11 = Message::GetMetadata(options);
  fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Reflection::ListFields(MVar11.reflection,options,&fields);
  ppFVar5 = fields.
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppFVar8 = fields.
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppFVar8 != ppFVar5;
      ppFVar8 = ppFVar8 + 1) {
    this = *ppFVar8;
    bVar6 = FieldDescriptor::is_repeated(this);
    iVar7 = 1;
    if (bVar6) {
      iVar7 = Reflection::FieldSize(MVar11.reflection,options,this);
    }
    iVar10 = 0;
    if (iVar7 < 1) {
      iVar7 = 0;
    }
    for (; iVar7 != iVar10; iVar10 = iVar10 + 1) {
      fieldval._M_dataplus._M_p = (pointer)&fieldval.field_2;
      fieldval._M_string_length = 0;
      fieldval.field_2._M_local_buf[0] = '\0';
      if ((this->type_ & 0xfe) == 10) {
        tmp._M_string_length = 0;
        tmp._M_dataplus._M_p = (pointer)&tmp.field_2;
        tmp.field_2._M_local_buf[0] = '\0';
        TextFormat::Printer::Printer(&printer);
        printer.expand_any_ = true;
        printer.initial_indent_level_ = depth + 1;
        iVar9 = -1;
        if (bVar6) {
          iVar9 = iVar10;
        }
        in_R8 = (AlphaNum *)&tmp;
        TextFormat::Printer::PrintFieldValueToString(&printer,options,this,iVar9,(string *)in_R8);
        std::__cxx11::string::append((char *)&fieldval);
        std::__cxx11::string::append((string *)&fieldval);
        std::__cxx11::string::append((ulong)&fieldval,(char)depth * '\x02');
        std::__cxx11::string::append((char *)&fieldval);
        TextFormat::Printer::~Printer(&printer);
        std::__cxx11::string::~string((string *)&tmp);
      }
      else {
        iVar9 = -1;
        if (bVar6) {
          iVar9 = iVar10;
        }
        TextFormat::PrintFieldValueToString(options,this,iVar9,&fieldval);
      }
      name._M_dataplus._M_p = (pointer)&name.field_2;
      name._M_string_length = 0;
      name.field_2._M_local_buf[0] = '\0';
      if ((this->field_0x1 & 8) == 0) {
        puVar1 = (ushort *)(this->all_names_).payload_;
        tmp._M_dataplus._M_p._2_6_ = 0;
        tmp._M_dataplus._M_p._0_2_ = *puVar1;
        tmp._M_string_length = (long)puVar1 + ~(ulong)tmp._M_dataplus._M_p;
        std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                  ((string *)&printer,(basic_string_view<char,_std::char_traits<char>_> *)&tmp,
                   (allocator<char> *)&local_f0);
        std::__cxx11::string::operator=((string *)&name,(string *)&printer);
        this_00 = &printer;
      }
      else {
        printer._0_16_ = absl::lts_20250127::NullSafeStringView("(.");
        pcVar2 = (this->all_names_).payload_;
        tmp._M_dataplus._M_p._2_6_ = 0;
        tmp._M_dataplus._M_p._0_2_ = *(ushort *)(pcVar2 + 2);
        tmp._M_string_length = (size_type)(pcVar2 + ~(ulong)tmp._M_dataplus._M_p);
        local_f0.piece_ = absl::lts_20250127::NullSafeStringView(")");
        absl::lts_20250127::StrCat_abi_cxx11_
                  ((string *)&stack0xffffffffffffffb0,(lts_20250127 *)&printer,(AlphaNum *)&tmp,
                   &local_f0,in_R8);
        std::__cxx11::string::operator=((string *)&name,(string *)&stack0xffffffffffffffb0);
        this_00 = (Printer *)&stack0xffffffffffffffb0;
      }
      std::__cxx11::string::~string((string *)this_00);
      printer._8_8_ = name._M_dataplus._M_p;
      printer.initial_indent_level_ = (undefined4)name._M_string_length;
      printer.single_line_mode_ = (bool)name._M_string_length._4_1_;
      printer.use_field_number_ = (bool)name._M_string_length._5_1_;
      printer.use_short_repeated_primitives_ = (bool)name._M_string_length._6_1_;
      printer.insert_silent_marker_ = (bool)name._M_string_length._7_1_;
      tmp._0_16_ = absl::lts_20250127::NullSafeStringView(" = ");
      local_f0.piece_._M_str = fieldval._M_dataplus._M_p;
      local_f0.piece_._M_len = fieldval._M_string_length;
      absl::lts_20250127::StrCat_abi_cxx11_
                ((string *)&stack0xffffffffffffffb0,(lts_20250127 *)&printer,(AlphaNum *)&tmp,
                 &local_f0,in_R8);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)option_entries
                 ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  &stack0xffffffffffffffb0);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
      std::__cxx11::string::~string((string *)&name);
      std::__cxx11::string::~string((string *)&fieldval);
    }
  }
  pbVar3 = (option_entries->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar4 = (option_entries->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  std::
  _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~_Vector_base(&fields.
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 );
  return pbVar3 != pbVar4;
}

Assistant:

bool RetrieveOptionsAssumingRightPool(
    int depth, const Message& options,
    std::vector<std::string>* option_entries) {
  option_entries->clear();
  const Reflection* reflection = options.GetReflection();
  std::vector<const FieldDescriptor*> fields;
  reflection->ListFields(options, &fields);
  for (const FieldDescriptor* field : fields) {
    int count = 1;
    bool repeated = false;
    if (field->is_repeated()) {
      count = reflection->FieldSize(options, field);
      repeated = true;
    }
    for (int j = 0; j < count; j++) {
      std::string fieldval;
      if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
        std::string tmp;
        TextFormat::Printer printer;
        printer.SetExpandAny(true);
        printer.SetInitialIndentLevel(depth + 1);
        printer.PrintFieldValueToString(options, field, repeated ? j : -1,
                                        &tmp);
        fieldval.append("{\n");
        fieldval.append(tmp);
        fieldval.append(depth * 2, ' ');
        fieldval.append("}");
      } else {
        TextFormat::PrintFieldValueToString(options, field, repeated ? j : -1,
                                            &fieldval);
      }
      std::string name;
      if (field->is_extension()) {
        name = absl::StrCat("(.", field->full_name(), ")");
      } else {
        name = std::string(field->name());
      }
      option_entries->push_back(absl::StrCat(name, " = ", fieldval));
    }
  }
  return !option_entries->empty();
}